

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastPrintMatrix(Gia_Man_t *p,Vec_Wec_t *vProds,int fVerbose)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Wrd_t *vTemp;
  word *__s;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  word Truth;
  word local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  iVar1 = p->nObjs;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vTemp->nSize = 0;
  vTemp->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar4 << 3);
  }
  vTemp->pArray = __s;
  vTemp->nSize = iVar1;
  uVar10 = 0;
  memset(__s,0,(long)iVar1 << 3);
  uVar7 = vProds->nSize;
  if (0 < (int)uVar7) {
    lVar8 = 0;
    do {
      pVVar2 = vProds->pArray;
      if (0 < pVVar2[lVar8].nSize) {
        lVar6 = 0;
        do {
          if (pVVar2[lVar8].pArray[lVar6] < 0) goto LAB_008939b1;
          uVar7 = (uint)pVVar2[lVar8].pArray[lVar6] >> 1;
          if (p->nObjs <= (int)uVar7) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p->pObjs + uVar7) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(p->pObjs + uVar7)) {
            if (0 < (long)p_00->nSize) {
              lVar5 = 0;
              do {
                if (p_00->pArray[lVar5] == uVar7) goto LAB_00893726;
                lVar5 = lVar5 + 1;
              } while (p_00->nSize != lVar5);
            }
            Vec_IntPush(p_00,uVar7);
          }
LAB_00893726:
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVVar2[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
      uVar7 = vProds->nSize;
    } while (lVar8 < (int)uVar7);
  }
  if (0 < (int)uVar7) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + *(int *)((long)&vProds->pArray->nSize + lVar8);
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar8);
  }
  printf("Booth partial products: %d pps, %d unique, %d nodes.\n",(ulong)uVar10,
         (ulong)(uint)p_00->nSize);
  printf("Vector has %d entries: {",(ulong)(uint)p_00->nSize);
  if (0 < p_00->nSize) {
    lVar8 = 0;
    do {
      printf(" %d",(ulong)(uint)p_00->pArray[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < p_00->nSize);
  }
  puts(" }");
  if ((fVerbose != 0) && (0 < vProds->nSize)) {
    lVar8 = 0;
    do {
      pVVar2 = vProds->pArray;
      if (0 < pVVar2[lVar8].nSize) {
        uVar9 = 0;
        do {
          uVar7 = pVVar2[lVar8].pArray[uVar9];
          if ((int)uVar7 < 0) {
LAB_008939b1:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          printf("Obj = %4d : ",(ulong)(uVar7 >> 1));
          printf("Compl = %d  ",(ulong)(uVar7 & 1));
          printf("Rank = %2d  ",lVar8);
          local_38 = Gia_ObjComputeTruth6Cis(p,uVar7,p_00,vTemp);
          Extra_PrintHex(_stdout,(uint *)&local_38,p_00->nSize);
          if (p_00->nSize == 4) {
            printf("    ");
          }
          if (p_00->nSize == 3) {
            printf("      ");
          }
          if (p_00->nSize < 3) {
            printf("       ");
          }
          printf("  ");
          printf("Vector has %d entries: {",(ulong)(uint)p_00->nSize);
          if (0 < p_00->nSize) {
            lVar6 = 0;
            do {
              printf(" %d",(ulong)(uint)p_00->pArray[lVar6]);
              lVar6 = lVar6 + 1;
            } while (lVar6 < p_00->nSize);
          }
          puts(" }");
          if (uVar9 == pVVar2[lVar8].nSize - 1) {
            putchar(10);
          }
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)pVVar2[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vProds->nSize);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (word *)0x0;
  }
  free(vTemp);
  return;
}

Assistant:

void Wlc_BlastPrintMatrix( Gia_Man_t * p, Vec_Wec_t * vProds, int fVerbose )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;  word Truth;
    int i, k, iLit; 
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                Vec_IntPushUnique( vSupp, Abc_Lit2Var(iLit) );
    printf( "Booth partial products: %d pps, %d unique, %d nodes.\n", 
        Vec_WecSizeSize(vProds), Vec_IntSize(vSupp), Gia_ManAndNum(p) );
    Vec_IntPrint( vSupp );

    if ( fVerbose )
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            printf( "Obj = %4d : ", Abc_Lit2Var(iLit) );
            printf( "Compl = %d  ", Abc_LitIsCompl(iLit) );
            printf( "Rank = %2d  ", i );
            Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
            if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
            if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
            if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
            printf( "  " );
            Vec_IntPrint( vSupp );
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
}